

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPrivKeys
          (LegacyScriptPubKeyMan *this,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,int64_t timestamp)

{
  long lVar1;
  Span<const_unsigned_char> s;
  bool bVar2;
  reference params;
  int64_t in_RDX;
  ConstevalFormatString<1U> in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  CKeyID *id;
  CKey *key;
  pair<const_CKeyID,_CKey> *entry;
  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  WalletBatch batch;
  CPubKey pubkey;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  WalletDatabase *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  mapped_type *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  byte in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  ScriptPubKeyMan *in_stack_ffffffffffffff18;
  CPubKey *pubkey_00;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  byte bVar3;
  WalletBatch *in_stack_ffffffffffffff60;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pubkey_00 = in_RDI;
  (**(code **)(**(long **)(in_RDI->vch + 8) + 0x18))();
  WalletBatch::WalletBatch
            ((WalletBatch *)
             CONCAT17(in_stack_fffffffffffffedf,
                      CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
             in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::begin
            ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              *)in_stack_fffffffffffffed0);
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::end
            ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              *)in_stack_fffffffffffffed0);
  do {
    bVar2 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffedf,
                                              CONCAT16(in_stack_fffffffffffffede,
                                                       in_stack_fffffffffffffed8)),
                            (_Self *)in_stack_fffffffffffffed0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar3 = 1;
LAB_003fca9f:
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (bool)(bVar3 & 1);
      }
      __stack_chk_fail();
    }
    params = std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_> *)
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)))
    ;
    in_stack_fffffffffffffef7 =
         CKey::VerifyPubKey((CKey *)in_stack_ffffffffffffff08,
                            (CPubKey *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                           );
    if (!(bool)in_stack_fffffffffffffef7) {
      __assert_fail("key.VerifyPubKey(pubkey)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x65d,
                    "bool wallet::LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey> &, const int64_t)"
                   );
    }
    in_stack_fffffffffffffef6 = (**(code **)(*(long *)in_RDI->vch + 0xe8))(in_RDI,params);
    if ((in_stack_fffffffffffffef6 & 1) == 0) {
      in_stack_fffffffffffffee8 =
           std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                         *)CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                        (key_type *)in_stack_fffffffffffffee8);
      in_stack_fffffffffffffee8->nCreateTime = in_RDX;
      in_stack_fffffffffffffedf =
           AddKeyPubKeyWithDB(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                              (CKey *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                              pubkey_00);
      if (!(bool)in_stack_fffffffffffffedf) {
        bVar3 = 0;
        goto LAB_003fca9f;
      }
      UpdateTimeFirstKey((LegacyScriptPubKeyMan *)
                         CONCAT17(in_stack_fffffffffffffedf,
                                  CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                         (int64_t)in_stack_fffffffffffffed0);
    }
    else {
      in_stack_ffffffffffffff08 = "Already have key with pubkey %s, skipping\n";
      Span<const_unsigned_char>::Span<CPubKey>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffedf,
                          CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                 (CPubKey *)in_stack_fffffffffffffed0,
                 (type)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      s.m_size._0_7_ = in_stack_ffffffffffffff58;
      s.m_data = pubkey_00->vch;
      s.m_size._7_1_ = in_stack_ffffffffffffff5f;
      HexStr_abi_cxx11_(s);
      ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                (in_stack_ffffffffffffff18,in_RSI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    }
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_> *)
               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  } while( true );
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey>& privkey_map, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : privkey_map) {
        const CKey& key = entry.second;
        CPubKey pubkey = key.GetPubKey();
        const CKeyID& id = entry.first;
        assert(key.VerifyPubKey(pubkey));
        // Skip if we already have the key
        if (HaveKey(id)) {
            WalletLogPrintf("Already have key with pubkey %s, skipping\n", HexStr(pubkey));
            continue;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;
        // If the private key is not present in the wallet, insert it.
        if (!AddKeyPubKeyWithDB(batch, key, pubkey)) {
            return false;
        }
        UpdateTimeFirstKey(timestamp);
    }
    return true;
}